

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O2

bool __thiscall
cmBinUtilsWindowsPELinker::ScanDependencies
          (cmBinUtilsWindowsPELinker *this,string *file,TargetType param_2)

{
  cmRuntimeDependencyArchive *this_00;
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  pointer pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  bool bVar5;
  bool resolved;
  bool unique;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  needed;
  string path;
  string origin;
  
  needed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  needed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  needed.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar3 = (*((this->Tool)._M_t.
             super___uniq_ptr_impl<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
             ._M_t.
             super__Tuple_impl<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
             .super__Head_base<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_false>.
            _M_head_impl)->_vptr_cmBinUtilsWindowsPEGetRuntimeDependenciesTool[2])();
  pbVar1 = needed.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((char)iVar3 == '\0') {
    bVar5 = false;
  }
  else {
    for (pbVar4 = needed.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1)
    {
      cmsys::SystemTools::LowerCase(&origin,pbVar4);
      std::__cxx11::string::operator=((string *)pbVar4,(string *)&origin);
      std::__cxx11::string::~string((string *)&origin);
    }
    cmsys::SystemTools::GetFilenamePath(&origin,file);
    pbVar1 = needed.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar4 = needed.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; bVar5 = pbVar4 == pbVar1, !bVar5;
        pbVar4 = pbVar4 + 1) {
      bVar2 = cmRuntimeDependencyArchive::IsPreExcluded
                        ((this->super_cmBinUtilsLinker).Archive,pbVar4);
      if (!bVar2) {
        path._M_dataplus._M_p = (pointer)&path.field_2;
        path._M_string_length = 0;
        path.field_2._M_local_buf[0] = '\0';
        resolved = false;
        ResolveDependency(this,pbVar4,&origin,&path,&resolved);
        this_00 = (this->super_cmBinUtilsLinker).Archive;
        if (resolved == true) {
          bVar2 = cmRuntimeDependencyArchive::IsPostExcluded(this_00,&path);
          if (!bVar2) {
            cmRuntimeDependencyArchive::AddResolvedPath
                      ((this->super_cmBinUtilsLinker).Archive,pbVar4,&path,&unique);
            if (unique == true) {
              iVar3 = (*(this->super_cmBinUtilsLinker)._vptr_cmBinUtilsLinker[3])(this,&path,2);
              if ((char)iVar3 == '\0') {
                std::__cxx11::string::~string((string *)&path);
                break;
              }
            }
          }
        }
        else {
          cmRuntimeDependencyArchive::AddUnresolvedPath(this_00,pbVar4);
        }
        std::__cxx11::string::~string((string *)&path);
      }
    }
    std::__cxx11::string::~string((string *)&origin);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&needed);
  return bVar5;
}

Assistant:

bool cmBinUtilsWindowsPELinker::ScanDependencies(
  std::string const& file, cmStateEnums::TargetType /* unused */)
{
  std::vector<std::string> needed;
  if (!this->Tool->GetFileInfo(file, needed)) {
    return false;
  }
  for (auto& n : needed) {
    n = cmSystemTools::LowerCase(n);
  }
  std::string origin = cmSystemTools::GetFilenamePath(file);

  for (auto const& lib : needed) {
    if (!this->Archive->IsPreExcluded(lib)) {
      std::string path;
      bool resolved = false;
      if (!this->ResolveDependency(lib, origin, path, resolved)) {
        return false;
      }
      if (resolved) {
        if (!this->Archive->IsPostExcluded(path)) {
          bool unique;
          this->Archive->AddResolvedPath(lib, path, unique);
          if (unique &&
              !this->ScanDependencies(path, cmStateEnums::SHARED_LIBRARY)) {
            return false;
          }
        }
      } else {
        this->Archive->AddUnresolvedPath(lib);
      }
    }
  }

  return true;
}